

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O3

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::CloneMap
          (SerializationCloner<Js::StreamWriter> *this,Src src,Dst dst)

{
  MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
  *pMVar1;
  Type TVar2;
  bool bVar3;
  JavascriptMap *this_00;
  Engine *pEVar4;
  uint local_4c;
  undefined1 local_48 [4];
  uint unused;
  Iterator iter;
  
  this_00 = VarTo<Js::JavascriptMap>(src);
  local_48 = (undefined1  [4])JavascriptMap::Size(this_00);
  StreamWriter::Write<unsigned_int>(this->m_writer,(uint *)local_48);
  JavascriptMap::GetIterator((JavascriptMap *)local_48);
  while( true ) {
    bVar3 = MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
            ::Iterator::Next((Iterator *)local_48);
    TVar2 = iter.list;
    if (!bVar3) break;
    pEVar4 = ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
             ::GetEngine(&this->
                          super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                        );
    pMVar1 = TVar2.ptr[1].first.ptr;
    Memory::Recycler::WBSetBit((char *)&iter.current);
    iter.current.ptr = pMVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&iter.current);
    SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone
              (pEVar4,iter.current.ptr,&local_4c);
    pEVar4 = ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
             ::GetEngine(&this->
                          super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                        );
    pMVar1 = TVar2.ptr[1].last.ptr;
    Memory::Recycler::WBSetBit((char *)&iter.current);
    iter.current.ptr = pMVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&iter.current);
    SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone
              (pEVar4,iter.current.ptr,&local_4c);
  }
  return;
}

Assistant:

void SerializationCloner<Writer>::CloneMap(Src src, Dst dst)
    {
        JavascriptMap* map = VarTo<JavascriptMap>(src);

        Write((int32)(map->Size()));

        JavascriptMap::MapDataList::Iterator iter = map->GetIterator();
        while (iter.Next())
        {
            const JavascriptMap::MapDataKeyValuePair& entry = iter.Current();
            this->GetEngine()->Clone(entry.Key());
            this->GetEngine()->Clone(entry.Value());
        }
    }